

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  uint uVar1;
  TextRange *pTVar2;
  char *pcVar3;
  TextRange *__dest;
  size_t sVar4;
  ulong uVar5;
  TextRange *pTVar6;
  long lVar7;
  ulong uVar8;
  TextRange input_range;
  TextRange local_38;
  
  if ((this->Filters).Capacity < 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    pTVar6 = (TextRange *)0x0;
    __dest = (TextRange *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pTVar2 = (this->Filters).Data;
    if (pTVar2 != (TextRange *)0x0) {
      memcpy(__dest,pTVar2,(long)(this->Filters).Size << 4);
      pTVar6 = (this->Filters).Data;
      if (pTVar6 == (TextRange *)0x0) {
        pTVar6 = (TextRange *)0x0;
      }
      else {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
    }
    (*GImAllocatorFreeFunc)(pTVar6,GImAllocatorUserData);
    (this->Filters).Data = __dest;
    (this->Filters).Capacity = 0;
  }
  (this->Filters).Size = 0;
  sVar4 = strlen(this->InputBuf);
  local_38.e = this->InputBuf + sVar4;
  local_38.b = this->InputBuf;
  TextRange::split(&local_38,',',&this->Filters);
  this->CountGrep = 0;
  uVar1 = (this->Filters).Size;
  uVar5 = (ulong)uVar1;
  if (uVar1 != 0) {
    lVar7 = 0;
    uVar8 = 0;
    do {
      if ((long)(int)uVar5 <= (long)uVar8) {
LAB_00147587:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                      ,0x49a,
                      "value_type &ImVector<ImGuiTextFilter::TextRange>::operator[](int) [T = ImGuiTextFilter::TextRange]"
                     );
      }
      TextRange::trim_blanks((TextRange *)((long)&((this->Filters).Data)->b + lVar7));
      uVar1 = (this->Filters).Size;
      uVar5 = (ulong)(int)uVar1;
      if ((long)uVar5 <= (long)uVar8) goto LAB_00147587;
      pTVar2 = (this->Filters).Data;
      pcVar3 = *(char **)((long)&pTVar2->b + lVar7);
      if ((pcVar3 != *(char **)((long)&pTVar2->e + lVar7)) && (*pcVar3 != '-')) {
        this->CountGrep = this->CountGrep + 1;
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (uVar8 != uVar1);
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    TextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        Filters[i].trim_blanks();
        if (Filters[i].empty())
            continue;
        if (Filters[i].front() != '-')
            CountGrep += 1;
    }
}